

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_argument
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_int_t nVar1;
  undefined1 local_50 [8];
  ngx_str_t value;
  size_t len;
  u_char *arg;
  ngx_str_t *name;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  value.data = (u_char *)(*(long *)data - 4);
  nVar1 = ngx_http_arg(r,(u_char *)(*(long *)(data + 8) + 4),(size_t)value.data,
                       (ngx_str_t *)local_50);
  if (nVar1 == 0) {
    v->data = (u_char *)value.len;
    *(uint *)v = *(uint *)v & 0xf0000000 | local_50._0_4_ & 0xfffffff;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
  }
  else {
    *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_argument(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_str_t *name = (ngx_str_t *) data;

    u_char     *arg;
    size_t      len;
    ngx_str_t   value;

    len = name->len - (sizeof("arg_") - 1);
    arg = name->data + sizeof("arg_") - 1;

    if (ngx_http_arg(r, arg, len, &value) != NGX_OK) {
        v->not_found = 1;
        return NGX_OK;
    }

    v->data = value.data;
    v->len = value.len;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    return NGX_OK;
}